

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O1

void SDL_UpdateRect(SDL12_Surface *screen12,Sint32 x,Sint32 y,Uint32 w,Uint32 h)

{
  SDL12_Rect rect12;
  SDL12_Rect local_8;
  
  if (screen12 != (SDL12_Surface *)0x0) {
    local_8.y = (Sint16)y;
    local_8.x = (Sint16)x;
    if (w == 0) {
      w = screen12->w;
    }
    local_8.w = (Uint16)w;
    if (h == 0) {
      h = screen12->h;
    }
    local_8.h = (Uint16)h;
    SDL_UpdateRects(screen12,1,&local_8);
  }
  return;
}

Assistant:

SDLCALL
SDL_UpdateRect(SDL12_Surface *screen12, Sint32 x, Sint32 y, Uint32 w, Uint32 h)
{
    if (screen12) {
        SDL12_Rect rect12;
        rect12.x = (Sint16) x;
        rect12.y = (Sint16) y;
        rect12.w = (Uint16) (w ? w : screen12->w);
        rect12.h = (Uint16) (h ? h : screen12->h);
        SDL_UpdateRects(screen12, 1, &rect12);
    }
}